

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.cxx
# Opt level: O3

bool __thiscall
cmConfigureFileCommand::InitialPass
          (cmConfigureFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *inName;
  cmNewLineStyle *this_00;
  char *in_name;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  char *__s;
  ostream *poVar4;
  char *pcVar5;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  pointer pbVar9;
  ulong uVar10;
  string unknown_args;
  string msg;
  string errorMessage;
  string local_1f0;
  string local_1d0;
  char *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9) < 0x21) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments, expected 2","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
  }
  else {
    in_name = (pbVar9->_M_dataplus)._M_p;
    bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (!bVar2) {
      __s = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      pcVar5 = (char *)(this->InputFile)._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&this->InputFile,0,pcVar5,(ulong)__s);
      std::__cxx11::string::append((char *)&this->InputFile);
    }
    std::__cxx11::string::append((char *)&this->InputFile);
    bVar2 = cmsys::SystemTools::FileIsDirectory(&this->InputFile);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"input location\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(this->InputFile)._M_dataplus._M_p,
                          (this->InputFile)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"is a directory but a file was expected.",0x27);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                 local_1f0.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return false;
    }
    bVar2 = cmsys::SystemTools::FileIsFullPath
                      ((args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    if (!bVar2) {
      pcVar5 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
      local_1b0 = (char *)(this->OutputFile)._M_string_length;
      strlen(pcVar5);
      std::__cxx11::string::_M_replace((ulong)&this->OutputFile,0,local_1b0,(ulong)pcVar5);
      std::__cxx11::string::append((char *)&this->OutputFile);
    }
    inName = &this->OutputFile;
    std::__cxx11::string::append((char *)inName);
    bVar2 = cmsys::SystemTools::FileIsDirectory(inName);
    if (bVar2) {
      std::__cxx11::string::append((char *)inName);
      std::__cxx11::string::string((string *)&local_1f0,in_name,(allocator *)&local_1d0);
      cmsys::SystemTools::GetFilenameName((string *)local_1a8,&local_1f0);
      std::__cxx11::string::_M_append((char *)inName,local_1a8._0_8_);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                 local_1f0.field_2._M_local_buf[0]) + 1);
      }
    }
    bVar2 = cmMakefile::CanIWriteThisFile
                      ((this->super_cmCommand).Makefile,(this->OutputFile)._M_dataplus._M_p);
    if (bVar2) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      local_1a8._8_8_ = 0;
      local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffffffffff00;
      this_00 = &this->NewLineStyle;
      bVar2 = cmNewLineStyle::ReadFromArguments(this_00,args,(string *)local_1a8);
      if (bVar2) {
        this->CopyOnly = false;
        this->EscapeQuotes = false;
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        local_1f0._M_string_length = 0;
        local_1f0.field_2._M_local_buf[0] = '\0';
        this->AtOnly = false;
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (0x40 < (ulong)((long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9)) {
          uVar1 = 3;
          uVar10 = 2;
          do {
            uVar8 = uVar1;
            iVar3 = std::__cxx11::string::compare((char *)(pbVar9 + uVar10));
            if (iVar3 == 0) {
              this->CopyOnly = true;
              bVar2 = cmNewLineStyle::IsValid(this_00);
              if (bVar2) {
                local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1d0,
                           "COPYONLY could not be used in combination with NEWLINE_STYLE","");
                cmCommand::SetError(&this->super_cmCommand,&local_1d0);
                goto LAB_00267d75;
              }
            }
            else {
              iVar3 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar10));
              if (iVar3 == 0) {
                this->EscapeQuotes = true;
              }
              else {
                iVar3 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar10));
                if (iVar3 == 0) {
                  this->AtOnly = true;
                }
                else {
                  iVar3 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar10));
                  if ((((iVar3 != 0) &&
                       (iVar3 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar10)), iVar3 != 0)) &&
                      (iVar3 = std::__cxx11::string::compare
                                         ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar10)), iVar3 != 0)) &&
                     (((iVar3 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar10)), iVar3 != 0 &&
                       (iVar3 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar10)), iVar3 != 0)) &&
                      ((iVar3 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar10)), iVar3 != 0 &&
                       (iVar3 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar10)), iVar3 != 0)))))) {
                    std::__cxx11::string::append((char *)&local_1f0);
                    std::__cxx11::string::_M_append
                              ((char *)&local_1f0,
                               (ulong)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus
                                      ._M_p);
                    std::__cxx11::string::append((char *)&local_1f0);
                  }
                }
              }
            }
            pbVar9 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar1 = (ulong)((int)uVar8 + 1);
            uVar10 = uVar8;
          } while (uVar8 < (ulong)((long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9
                                  >> 5));
          if (local_1f0._M_string_length != 0) {
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1d0,"configure_file called with unknown argument(s):\n","");
            std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
            cmMakefile::IssueMessage((this->super_cmCommand).Makefile,AUTHOR_WARNING,&local_1d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        iVar3 = cmMakefile::ConfigureFile
                          ((this->super_cmCommand).Makefile,(this->InputFile)._M_dataplus._M_p,
                           (this->OutputFile)._M_dataplus._M_p,this->CopyOnly,this->AtOnly,
                           this->EscapeQuotes,this_00);
        bVar2 = true;
        if (iVar3 == 0) {
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d0,"Problem configuring file","");
          cmCommand::SetError(&this->super_cmCommand,&local_1d0);
LAB_00267d75:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          bVar2 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,
                          CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                   local_1f0.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
        bVar2 = false;
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        return bVar2;
      }
      return bVar2;
    }
    std::operator+(&local_1f0,"attempted to configure a file: ",inName);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    local_1a8._0_8_ = local_1a8 + 0x10;
    puVar7 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar7) {
      local_1a8._16_8_ = *puVar7;
      local_1a8._24_8_ = plVar6[3];
    }
    else {
      local_1a8._16_8_ = *puVar7;
      local_1a8._0_8_ = (ulong *)*plVar6;
    }
    local_1a8._8_8_ = plVar6[1];
    *plVar6 = (long)puVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,
                      CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                               local_1f0.field_2._M_local_buf[0]) + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    cmSystemTools::s_FatalErrorOccured = true;
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  return false;
}

Assistant:

bool cmConfigureFileCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments, expected 2");
    return false;
    }

  const char* inFile = args[0].c_str();
  if(!cmSystemTools::FileIsFullPath(inFile))
    {
    this->InputFile = this->Makefile->GetCurrentSourceDirectory();
    this->InputFile += "/";
    }
  this->InputFile += inFile;

  // If the input location is a directory, error out.
  if(cmSystemTools::FileIsDirectory(this->InputFile))
    {
    std::ostringstream e;
    e << "input location\n"
      << "  " << this->InputFile << "\n"
      << "is a directory but a file was expected.";
    this->SetError(e.str());
    return false;
    }

  const char* outFile = args[1].c_str();
  if(!cmSystemTools::FileIsFullPath(outFile))
    {
    this->OutputFile = this->Makefile->GetCurrentBinaryDirectory();
    this->OutputFile += "/";
    }
  this->OutputFile += outFile;

  // If the output location is already a directory put the file in it.
  if(cmSystemTools::FileIsDirectory(this->OutputFile))
    {
    this->OutputFile += "/";
    this->OutputFile += cmSystemTools::GetFilenameName(inFile);
    }

  if ( !this->Makefile->CanIWriteThisFile(this->OutputFile.c_str()) )
    {
    std::string e = "attempted to configure a file: " + this->OutputFile
      + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }
  std::string errorMessage;
  if (!this->NewLineStyle.ReadFromArguments(args, errorMessage))
    {
    this->SetError(errorMessage);
    return false;
    }
  this->CopyOnly = false;
  this->EscapeQuotes = false;

  std::string unknown_args;
  this->AtOnly = false;
  for(unsigned int i=2;i < args.size();++i)
    {
    if(args[i] == "COPYONLY")
      {
      this->CopyOnly = true;
      if (this->NewLineStyle.IsValid())
        {
        this->SetError("COPYONLY could not be used in combination "
                       "with NEWLINE_STYLE");
        return false;
        }
      }
    else if(args[i] == "ESCAPE_QUOTES")
      {
      this->EscapeQuotes = true;
      }
    else if(args[i] == "@ONLY")
      {
      this->AtOnly = true;
      }
    else if(args[i] == "IMMEDIATE")
      {
      /* Ignore legacy option.  */
      }
    else if(args[i] == "NEWLINE_STYLE" ||
            args[i] == "LF" || args[i] == "UNIX" ||
            args[i] == "CRLF" || args[i] == "WIN32" ||
            args[i] == "DOS")
      {
      /* Options handled by NewLineStyle member above.  */
      }
    else
      {
      unknown_args += " ";
      unknown_args += args[i];
      unknown_args += "\n";
      }
    }
  if (!unknown_args.empty())
    {
    std::string msg = "configure_file called with unknown argument(s):\n";
    msg += unknown_args;
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, msg);
    }

  if ( !this->ConfigureFile() )
    {
    this->SetError("Problem configuring file");
    return false;
    }

  return true;
}